

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O1

anon_class_136_17_7d744f41 *
qclab::qgates::lambda_QGate2<double>
          (anon_class_136_17_7d744f41 *__return_storage_ptr__,Op op,SquareMatrix<double> *mat2,
          double *vector)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  long lVar17;
  double *pdVar18;
  
  if (mat2->size_ == 4) {
    dense::operateInPlace<qclab::dense::SquareMatrix<double>>(op,mat2);
    lVar17 = mat2->size_;
    pdVar18 = (mat2->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
              super__Head_base<0UL,_double_*,_false>._M_head_impl;
    dVar1 = pdVar18[lVar17];
    dVar2 = (pdVar18 + 1)[lVar17];
    dVar3 = (pdVar18 + 2)[lVar17];
    dVar4 = (pdVar18 + 3)[lVar17];
    dVar5 = *pdVar18;
    dVar6 = pdVar18[1];
    dVar7 = pdVar18[lVar17 * 2];
    dVar8 = (pdVar18 + 1)[lVar17 * 2];
    dVar9 = pdVar18[lVar17 * 3];
    dVar10 = (pdVar18 + 1)[lVar17 * 3];
    dVar11 = pdVar18[2];
    dVar12 = (pdVar18 + 2)[lVar17 * 2];
    dVar13 = (pdVar18 + 2)[lVar17 * 3];
    dVar14 = pdVar18[3];
    dVar15 = (pdVar18 + 3)[lVar17 * 2];
    dVar16 = (pdVar18 + 3)[lVar17 * 3];
    __return_storage_ptr__->vector = vector;
    __return_storage_ptr__->m11 = dVar5;
    __return_storage_ptr__->m12 = dVar1;
    __return_storage_ptr__->m13 = dVar7;
    __return_storage_ptr__->m14 = dVar9;
    __return_storage_ptr__->m21 = dVar6;
    __return_storage_ptr__->m22 = dVar2;
    __return_storage_ptr__->m23 = dVar8;
    __return_storage_ptr__->m24 = dVar10;
    __return_storage_ptr__->m31 = dVar11;
    __return_storage_ptr__->m32 = dVar3;
    __return_storage_ptr__->m33 = dVar12;
    __return_storage_ptr__->m34 = dVar13;
    __return_storage_ptr__->m41 = dVar14;
    __return_storage_ptr__->m42 = dVar4;
    __return_storage_ptr__->m43 = dVar15;
    __return_storage_ptr__->m44 = dVar16;
    return __return_storage_ptr__;
  }
  __assert_fail("mat2.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/src/qgates/apply.hpp"
                ,0xae,
                "auto qclab::qgates::lambda_QGate2(Op, qclab::dense::SquareMatrix<T>, T *) [T = double]"
               );
}

Assistant:

auto lambda_QGate2( Op op , qclab::dense::SquareMatrix< T > mat2 ,
                      T* vector ) {
    assert( mat2.size() == 4 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat2 ) ;
    const T m11 = mat2( 0 , 0 ) ; const T m12 = mat2( 0 , 1 ) ;
    const T m13 = mat2( 0 , 2 ) ; const T m14 = mat2( 0 , 3 ) ;
    const T m21 = mat2( 1 , 0 ) ; const T m22 = mat2( 1 , 1 ) ;
    const T m23 = mat2( 1 , 2 ) ; const T m24 = mat2( 1 , 3 ) ;
    const T m31 = mat2( 2 , 0 ) ; const T m32 = mat2( 2 , 1 ) ;
    const T m33 = mat2( 2 , 2 ) ; const T m34 = mat2( 2 , 3 ) ;
    const T m41 = mat2( 3 , 0 ) ; const T m42 = mat2( 3 , 1 ) ;
    const T m43 = mat2( 3 , 2 ) ; const T m44 = mat2( 3 , 3 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ,
                   const uint64_t c , const uint64_t d ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      const T x3 = vector[c] ;
      const T x4 = vector[d] ;
      vector[a] = m11 * x1 + m12 * x2 + m13 * x3 + m14 * x4 ;
      vector[b] = m21 * x1 + m22 * x2 + m23 * x3 + m24 * x4 ;
      vector[c] = m31 * x1 + m32 * x2 + m33 * x3 + m34 * x4 ;
      vector[d] = m41 * x1 + m42 * x2 + m43 * x3 + m44 * x4 ;
    } ;
    return f ;
  }